

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# P2R.cpp
# Opt level: O0

void __thiscall
OpenMD::P2Z::P2Z(P2Z *this,SimInfo *info,string *filename,string *sele1,string *sele2,uint nbins,
                int axis)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  undefined4 in_stack_00000008;
  string paramString;
  stringstream params;
  SimInfo *in_stack_00000048;
  P2R *in_stack_00000050;
  string *in_stack_fffffffffffffd78;
  StaticAnalyser *this_00;
  string local_268 [32];
  stringstream local_248 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdc0;
  char *in_stack_fffffffffffffdc8;
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  string local_60 [96];
  
  P2R::P2R(in_stack_00000050,in_stack_00000048,_params,(string *)paramString.field_2._8_8_,
           (string *)paramString.field_2._M_allocated_capacity,paramString._M_string_length._4_4_);
  *(undefined ***)in_RDI = &PTR__P2Z_0055fc28;
  *(undefined4 *)&in_RDI[0x6b].field_0x4 = in_stack_00000008;
  this_00 = (StaticAnalyser *)&in_RDI[0x6b]._M_string_length;
  std::__cxx11::string::string((string *)this_00);
  if (*(int *)&in_RDI[0x6b].field_0x4 == 0) {
    std::__cxx11::string::operator=((string *)&in_RDI[0x6b]._M_string_length,"x");
  }
  else if (*(int *)&in_RDI[0x6b].field_0x4 == 1) {
    std::__cxx11::string::operator=((string *)&in_RDI[0x6b]._M_string_length,"y");
  }
  else {
    std::__cxx11::string::operator=((string *)&in_RDI[0x6b]._M_string_length,"z");
  }
  std::operator+(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
  std::operator+(in_RDI,(char *)this_00);
  StaticAnalyser::setAnalysisType(this_00,in_stack_fffffffffffffd78);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_80);
  getPrefix(in_RDI);
  std::operator+(in_RDI,(char *)this_00);
  StaticAnalyser::setOutputName(this_00,in_stack_fffffffffffffd78);
  std::__cxx11::string::~string(local_a0);
  std::__cxx11::string::~string(local_c0);
  std::__cxx11::stringstream::stringstream(local_248);
  std::__cxx11::stringstream::str();
  StaticAnalyser::setParameterString(this_00,in_stack_fffffffffffffd78);
  std::__cxx11::string::~string(local_268);
  std::__cxx11::stringstream::~stringstream(local_248);
  return;
}

Assistant:

P2Z::P2Z(SimInfo* info, const std::string& filename, const std::string& sele1,
           const std::string& sele2, unsigned int nbins, int axis) :
      P2R(info, filename, sele1, sele2, nbins),
      axis_(axis) {
    switch (axis_) {
    case 0:
      axisLabel_ = "x";
      break;
    case 1:
      axisLabel_ = "y";
      break;
    case 2:
    default:
      axisLabel_ = "z";
      break;
    }

    setAnalysisType("2nd order Legendre Polynomial Correlation using " +
                    axisLabel_ + " as reference axis");
    setOutputName(getPrefix(filename) + ".P2Z");
    std::stringstream params;
    const std::string paramString = params.str();
    setParameterString(paramString);
  }